

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O1

char * fmt::v5::internal::
       parse_width<char,fmt::v5::internal::specs_checker<fmt::v5::internal::specs_handler<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>>,char>>>&>
                 (char *begin,char *end,
                 specs_checker<fmt::v5::internal::specs_handler<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char>_>_>
                 *handler)

{
  char cVar1;
  error_handler eVar2;
  uint uVar3;
  specs_checker<fmt::v5::internal::specs_handler<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char>_>_>
  *in_RAX;
  assertion_failure *this;
  error_handler *peVar4;
  width_adapter<fmt::v5::internal::specs_checker<fmt::v5::internal::specs_handler<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char>_>_>_&,_char>
  local_18;
  
  if (begin == end) {
    this = (assertion_failure *)__cxa_allocate_exception(0x10);
    assertion_failure::assertion_failure(this,"");
    __cxa_throw(this,&assertion_failure::typeinfo,std::logic_error::~logic_error);
  }
  cVar1 = *begin;
  if ((byte)(cVar1 - 0x30U) < 10) {
    peVar4 = (error_handler *)(begin + 1);
    if (cVar1 == '0') {
      uVar3 = 0;
      end = (char *)peVar4;
    }
    else {
      uVar3 = 0;
      do {
        if (0xccccccc < uVar3) {
          uVar3 = 0x80000000;
          break;
        }
        uVar3 = ((int)(char)peVar4[-1] + uVar3 * 10) - 0x30;
        if (peVar4 == (error_handler *)end) goto LAB_00136a38;
        eVar2 = *peVar4;
        peVar4 = peVar4 + 1;
      } while ((byte)((char)eVar2 - 0x30U) < 10);
      end = (char *)(peVar4 + -1);
      peVar4 = (error_handler *)end;
LAB_00136a38:
      if ((int)uVar3 < 0) {
        error_handler::on_error(peVar4,"number is too big");
      }
    }
    (((handler->
      super_specs_handler<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char>_>
      ).super_specs_setter<char>.specs_)->super_align_spec).width_ = uVar3;
    begin = end;
  }
  else if (cVar1 == '{') {
    peVar4 = (error_handler *)(begin + 1);
    local_18.handler = in_RAX;
    if (peVar4 != (error_handler *)end) {
      local_18.handler = handler;
      peVar4 = (error_handler *)
               parse_arg_id<char,fmt::v5::internal::width_adapter<fmt::v5::internal::specs_checker<fmt::v5::internal::specs_handler<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>>,char>>>&,char>>
                         ((char *)peVar4,end,&local_18);
    }
    if ((peVar4 == (error_handler *)end) || (*peVar4 != (error_handler)0x7d)) {
      error_handler::on_error(peVar4,"invalid format string");
    }
    begin = (char *)(peVar4 + 1);
  }
  return (char *)(error_handler *)begin;
}

Assistant:

FMT_CONSTEXPR const Char *parse_width(
    const Char *begin, const Char *end, Handler &&handler) {
  FMT_ASSERT(begin != end, "");
  if ('0' <= *begin && *begin <= '9') {
    handler.on_width(parse_nonnegative_int(begin, end, handler));
  } else if (*begin == '{') {
    ++begin;
    if (begin != end)
      begin = parse_arg_id(begin, end, width_adapter<Handler, Char>(handler));
    if (begin == end || *begin != '}')
      return handler.on_error("invalid format string"), begin;
    ++begin;
  }
  return begin;
}